

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeGravityForces
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  Map<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_0,_Eigen::Stride<0,_0>_> GravForceCompact;
  assign_op<double,_double> local_29;
  double *local_28 [2];
  Product<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_0>
  local_18;
  
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x1b)
  {
    local_28[0] = (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
    local_18.m_lhs = &this->m_GravForceScale;
    local_18.m_rhs.m_matrix.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = G_acc->m_data;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,9,3,1,9,3>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>,0>,Eigen::internal::assign_op<double,double>>
              ((Map<Eigen::Matrix<double,_9,_3,_1,_9,_3>,_0,_Eigen::Stride<0,_0>_> *)local_28,
               &local_18,&local_29,(type)0x0);
    return;
  }
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamANCF_3333.cpp"
                ,0x1ac,
                "virtual void chrono::fea::ChElementBeamANCF_3333::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementBeamANCF_3333::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}